

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:889:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:889:17)>
             *this)

{
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_> *this_00;
  Disposer *pDVar1;
  PromiseFulfiller<int> *pPVar2;
  ReducePromises<int> node;
  CrossThreadPromiseFulfiller<int> *pCVar3;
  Executor *this_01;
  PromiseCrossThreadFulfillerPair<int> paf;
  int result;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  PromiseCrossThreadFulfillerPair<int> local_218;
  __pid_t local_1fc;
  char *local_1f8;
  char *pcStack_1f0;
  undefined8 local_1e8;
  EventLoop *local_1e0;
  undefined4 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  DebugComparison<int_&,_int> local_1c0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  EventLoop local_180;
  UnixEventPort local_108;
  
  UnixEventPort::UnixEventPort(&local_108);
  EventLoop::EventLoop(&local_180,&local_108.super_EventPort);
  local_1d8 = 0xffffffff;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = &local_180;
  EventLoop::enterScope(&local_180);
  this_01 = getCurrentThreadExecutor();
  Executor::newPromiseAndCrossThreadFulfiller<int>(&local_218,this_01);
  local_198 = local_218.fulfiller.disposer._0_4_;
  uStack_194 = local_218.fulfiller.disposer._4_4_;
  uStack_190 = local_218.fulfiller.ptr._0_4_;
  uStack_18c = local_218.fulfiller.ptr._4_4_;
  local_218.fulfiller.ptr = (CrossThreadPromiseFulfiller<int> *)0x0;
  this_00 = (this->f).fulfillerMutex;
  local_1c0.left = (int *)((ulong)local_1c0.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex,0);
  pDVar1 = (this_00->value).ptr.disposer;
  pPVar2 = (this_00->value).ptr.ptr;
  *(undefined4 *)&(this_00->value).ptr.disposer = local_198;
  *(undefined4 *)((long)&(this_00->value).ptr.disposer + 4) = uStack_194;
  *(undefined4 *)&(this_00->value).ptr.ptr = uStack_190;
  *(undefined4 *)((long)&(this_00->value).ptr.ptr + 4) = uStack_18c;
  if (pPVar2 != (PromiseFulfiller<int> *)0x0) {
    (**pDVar1->_vptr_Disposer)();
  }
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_1f0 = "operator()";
  local_1e8 = 0x120000037f;
  local_1fc = Promise<int>::wait(&local_218.promise,&local_1e0);
  local_1c0.left = &local_1fc;
  local_1c0.right = 0x7b;
  local_1c0.op.content.ptr = " == ";
  local_1c0.op.content.size_ = 5;
  local_1c0.result = local_1fc == 0x7b;
  if ((!local_1c0.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x380,ERROR,"\"failed: expected \" \"result == 123\", _kjCondition",
               (char (*) [31])"failed: expected result == 123",&local_1c0);
  }
  pCVar3 = local_218.fulfiller.ptr;
  if (local_218.fulfiller.ptr != (CrossThreadPromiseFulfiller<int> *)0x0) {
    local_218.fulfiller.ptr = (CrossThreadPromiseFulfiller<int> *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_218.fulfiller.disposer._4_4_,local_218.fulfiller.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_218.fulfiller.disposer._4_4_,local_218.fulfiller.disposer._0_4_),
               (pCVar3->super_PromiseFulfiller<int>).super_PromiseRejector._vptr_PromiseRejector[-2]
               + (long)&(pCVar3->super_PromiseFulfiller<int>).super_PromiseRejector.
                        _vptr_PromiseRejector);
  }
  node.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_218.promise;
  if (local_218.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_218.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  if (local_1d0 == 0) {
    EventLoop::leaveScope(local_1e0);
  }
  EventLoop::~EventLoop(&local_180);
  UnixEventPort::~UnixEventPort(&local_108);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }